

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_ResizeDown(ResizeForm2 Resize,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  code *in_RDI;
  uint32_t i;
  TimerContainer timer;
  Image output;
  Image input;
  Image *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  uint uVar2;
  uint local_fc;
  BaseTimerContainer *in_stack_ffffffffffffff30;
  undefined1 local_b0 [96];
  undefined1 local_50 [56];
  code *local_18;
  pair<double,_double> local_10;
  
  local_18 = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffed8,(uint8_t)((ulong)in_stack_fffffffffffffed0 >> 0x38)
             ,(uint8_t)((ulong)in_stack_fffffffffffffed0 >> 0x30));
  Test_Helper::uniformImage
            ((uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1746ef);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffed8,(uint8_t)((ulong)in_stack_fffffffffffffed0 >> 0x38)
             ,(uint8_t)((ulong)in_stack_fffffffffffffed0 >> 0x30));
  Test_Helper::uniformImage
            ((uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x17473f);
  SetupFunction((string *)0x17474c);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)in_stack_fffffffffffffed0);
  local_fc = 0;
  while( true ) {
    uVar2 = local_fc;
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)in_stack_fffffffffffffed0);
    (*local_18)(local_50,local_b0);
    Performance_Test::TimerContainer::stop
              ((TimerContainer *)CONCAT44(uVar2,in_stack_fffffffffffffee0));
    local_fc = local_fc + 1;
  }
  CleanupFunction((string *)0x174873);
  local_10 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff30);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x1748b5);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1748c2);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1748cf);
  return local_10;
}

Assistant:

std::pair < double, double > template_ResizeDown( ResizeForm2 Resize, const std::string & namespaceName, uint32_t size )
    {
        PenguinV_Image::Image input  = Performance_Test::uniformImage( size, size );
        PenguinV_Image::Image output = Performance_Test::uniformImage( size / 2, size / 2 );

        TEST_FUNCTION_LOOP( Resize( input, output ), namespaceName )
    }